

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O3

ktx_error_code_e ktxFileStream_construct(ktxStream *str,FILE *file,ktx_bool_t closeFileOnDestruct)

{
  ktx_error_code_e kVar1;
  
  kVar1 = KTX_INVALID_VALUE;
  if (file != (FILE *)0x0 && str != (ktxStream *)0x0) {
    (str->data).file = file;
    str->readpos = 0;
    str->type = eStreamTypeFile;
    str->read = ktxFileStream_read;
    str->skip = ktxFileStream_skip;
    str->write = ktxFileStream_write;
    str->getpos = ktxFileStream_getpos;
    str->setpos = ktxFileStream_setpos;
    str->getsize = ktxFileStream_getsize;
    str->destruct = ktxFileStream_destruct;
    str->closeOnDestruct = closeFileOnDestruct;
    kVar1 = KTX_SUCCESS;
  }
  return kVar1;
}

Assistant:

KTX_error_code ktxFileStream_construct(ktxStream* str, FILE* file,
                                       ktx_bool_t closeFileOnDestruct)
{
    if (!str || !file)
        return KTX_INVALID_VALUE;

    str->data.file = file;
    str->readpos = 0;
    str->type = eStreamTypeFile;
    str->read = ktxFileStream_read;
    str->skip = ktxFileStream_skip;
    str->write = ktxFileStream_write;
    str->getpos = ktxFileStream_getpos;
    str->setpos = ktxFileStream_setpos;
    str->getsize = ktxFileStream_getsize;
    str->destruct = ktxFileStream_destruct;
    str->closeOnDestruct = closeFileOnDestruct;

    return KTX_SUCCESS;
}